

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

double __thiscall sophia_interface::crossection(sophia_interface *this,double x,int NDIR,int NL0)

{
  runtime_error *prVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_228;
  sophia_interface *local_210;
  double xSection;
  double cs_delta;
  double cs_tmp;
  double ss2;
  double ss1;
  double cs_multi;
  double cs_multidiff;
  double cross_diffr2;
  double cross_diffr1;
  double cross_diffr;
  double cross_frag2;
  double dStack_1b0;
  int Ni;
  double cross_dir2;
  double cross_dir1;
  double cross_dir;
  double cross_res;
  double s;
  double pm;
  double sth;
  double sig_res [9];
  int i_1;
  int i;
  double WIDTH [9];
  double local_d8;
  double AMRES [9];
  double local_88;
  double SIG0 [9];
  double AM2;
  int NL0_local;
  int NDIR_local;
  double x_local;
  sophia_interface *this_local;
  
  if ((NL0 != 0xd) && (NL0 != 0xe)) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"crossection: particle ID incorrectly specified.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_228 = 0.880351;
  if (NL0 != 0xd) {
    local_228 = 0.882792;
  }
  SIG0[8] = local_228;
  memset(&local_88,0,0x48);
  memset(&local_d8,0,0x48);
  memset(&i_1,0,0x48);
  if (NL0 == 0xd) {
    for (sig_res[8]._4_4_ = 0; sig_res[8]._4_4_ < 9; sig_res[8]._4_4_ = sig_res[8]._4_4_ + 1) {
      SIG0[(long)sig_res[8]._4_4_ + -1] =
           (4.893089117 / SIG0[8]) * RATIOJp[sig_res[8]._4_4_] * BGAMMAp[sig_res[8]._4_4_];
      AMRES[(long)sig_res[8]._4_4_ + -1] = AMRESp[sig_res[8]._4_4_];
      *(double *)(&i_1 + (long)sig_res[8]._4_4_ * 2) = WIDTHp[sig_res[8]._4_4_];
    }
  }
  if (NL0 == 0xe) {
    for (sig_res[8]._0_4_ = 0; sig_res[8]._0_4_ < 9; sig_res[8]._0_4_ = sig_res[8]._0_4_ + 1) {
      SIG0[(long)sig_res[8]._0_4_ + -1] =
           (4.893089117 / SIG0[8]) * RATIOJn[sig_res[8]._0_4_] * BGAMMAn[sig_res[8]._0_4_];
      AMRES[(long)sig_res[8]._0_4_ + -1] = AMRESn[sig_res[8]._0_4_];
      *(double *)(&i_1 + (long)sig_res[8]._0_4_ * 2) = WIDTHn[sig_res[8]._0_4_];
    }
  }
  memset(&sth,0,0x48);
  dVar2 = AM[NL0 + -1];
  dVar2 = dVar2 * dVar2 + dVar2 * 2.0 * x;
  if (1.1646 <= dVar2) {
    cross_dir = 0.0;
    cross_dir1 = 0.0;
    cross_dir2 = 0.0;
    dStack_1b0 = 0.0;
    if (x <= 10.0) {
      dVar3 = breitwigner(this,local_88,_i_1,local_d8,x);
      dVar4 = Ef(this,x,0.152,0.17);
      cross_dir = dVar3 * dVar4;
      sth = cross_dir;
      for (cross_frag2._4_4_ = 1; cross_frag2._4_4_ < 9; cross_frag2._4_4_ = cross_frag2._4_4_ + 1)
      {
        dVar3 = breitwigner(this,SIG0[(long)cross_frag2._4_4_ + -1],
                            *(double *)(&i_1 + (long)cross_frag2._4_4_ * 2),
                            AMRES[(long)cross_frag2._4_4_ + -1],x);
        dVar4 = Ef(this,x,0.15,0.38);
        sig_res[(long)cross_frag2._4_4_ + -1] = dVar3 * dVar4;
        cross_dir = sig_res[(long)cross_frag2._4_4_ + -1] + cross_dir;
      }
      if ((x <= 0.1) || (0.6 <= x)) {
        cross_dir2 = singleback(this,x);
      }
      else {
        dVar3 = singleback(this,x);
        dVar4 = exp((-(x - 0.29) * (x - 0.29)) / 0.002);
        dVar5 = exp((-(x - 0.37) * (x - 0.37)) / 0.002);
        cross_dir2 = dVar5 * -15.0 + dVar4 * 40.0 + dVar3;
      }
      dStack_1b0 = twoback(this,x);
      cross_dir1 = cross_dir2 + dStack_1b0;
    }
    cross_diffr = 0.0;
    if (NL0 == 0xd) {
      dVar3 = Ef(this,x,0.5,0.1);
      dVar4 = pow(dVar2,-0.34);
      cross_diffr = dVar3 * 80.3 * dVar4;
    }
    else if (NL0 == 0xe) {
      dVar3 = Ef(this,x,0.5,0.1);
      dVar4 = pow(dVar2,-0.34);
      cross_diffr = dVar3 * 60.2 * dVar4;
    }
    cross_diffr1 = 0.0;
    cross_diffr2 = 0.0;
    cs_multi = 0.0;
    ss1 = 0.0;
    if (0.85 < x) {
      cs_tmp = 0.0;
      if (NL0 == 0xd) {
        dVar3 = pow(dVar2,-0.34);
        dVar4 = pow(dVar2,0.095);
        cs_tmp = dVar3 * 29.3 + dVar4 * 59.3;
      }
      else if (NL0 == 0xe) {
        dVar3 = pow(dVar2,-0.34);
        dVar4 = pow(dVar2,0.095);
        cs_tmp = dVar3 * 26.4 + dVar4 * 59.3;
      }
      dVar3 = exp(-((x - 0.85) / 0.69));
      dVar3 = (1.0 - dVar3) * cs_tmp;
      ss1 = dVar3 * 0.89;
      dVar4 = pow(x - 0.85,0.75);
      dVar5 = pow(x,-0.44);
      dVar2 = pow(dVar2,0.08);
      dVar4 = exp(-(dVar4 / 0.64));
      dVar2 = (1.0 - dVar4) * 0.96 * (dVar5 * 74.1 + dVar2 * 62.0);
      cross_diffr2 = dVar2 * 0.14;
      dVar2 = dVar2 * 0.013;
      dVar3 = cross_diffr - ((cross_diffr2 + dVar2) - dVar3 * 0.11);
      cross_diffr = dVar3;
      if (dVar3 < 0.0) {
        cross_diffr = 0.0;
        ss1 = dVar3 + ss1;
      }
      cross_diffr1 = cross_diffr2 + dVar2;
      cs_multi = ss1 + cross_diffr1;
    }
    switch(NDIR) {
    case 0:
      local_210 = (sophia_interface *)(cross_dir + cross_dir1 + cross_diffr1 + cross_diffr);
      break;
    case 1:
      local_210 = (sophia_interface *)cross_dir;
      break;
    case 2:
      local_210 = (sophia_interface *)(cross_dir + cross_dir1);
      break;
    case 3:
      local_210 = (sophia_interface *)(cross_dir + cross_dir1 + cs_multi + cross_diffr);
      break;
    case 4:
      local_210 = (sophia_interface *)cross_dir1;
      break;
    case 5:
      local_210 = (sophia_interface *)ss1;
      break;
    case 6:
      local_210 = (sophia_interface *)(cross_dir + dStack_1b0);
      break;
    case 7:
      local_210 = (sophia_interface *)(cross_dir + cross_dir2);
      break;
    case 8:
      local_210 = (sophia_interface *)(cross_dir + cross_dir1 + cross_diffr2);
      break;
    case 9:
      local_210 = (sophia_interface *)(cross_dir + cross_dir1 + cross_diffr1);
      break;
    case 10:
      local_210 = (sophia_interface *)cross_diffr1;
      break;
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      local_210 = (sophia_interface *)sig_res[(long)(NDIR + -0xb) + -1];
      break;
    default:
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,"wrong input NDIR in crossection.f !");
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local = local_210;
  }
  else {
    this_local = (sophia_interface *)0x0;
  }
  return (double)this_local;
}

Assistant:

double sophia_interface::crossection(double x, int NDIR, int NL0) {
// calculates crossection of Nucleon-gamma-interaction
// (see thesis of J.Rachen, p.45ff and corrections
// report from 27/04/98, 5/05/98, 22/05/98 of J.Rachen)
// ** Date: 20/01/98   **
// ** correct.:27/04/98**
// ** update: 23/05/98 **
// ** author: A.Muecke **

    if (NL0 != 13 && NL0 != 14) throw std::runtime_error("crossection: particle ID incorrectly specified.");
    const double AM2 = (NL0 == 13)? 0.880351 : 0.882792;  // used to be array AM2[49]. Only these two values of it are ever used.
    double SIG0[9] = {0.};
    double AMRES[9] = {0.};
    double WIDTH[9] = {0.};

    if (NL0 == 13) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJp[i] * BGAMMAp[i];
            AMRES[i] = AMRESp[i];
            WIDTH[i] = WIDTHp[i];
        }
    }

    if (NL0 == 14) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJn[i] * BGAMMAn[i];
            AMRES[i] = AMRESn[i];
            WIDTH[i] = WIDTHn[i];
        }
    }

    double sig_res[9] = {0.};

    const double sth = 1.1646;
    const double pm = AM[NL0 - 1];
    const double s = pm * pm + 2. * pm * x;
    if (s < sth) {
        return 0.;
    }
    double cross_res = 0.;
    double cross_dir = 0.;
    double cross_dir1 = 0.;
    double cross_dir2 = 0.;
    if (x <= 10.) {
        // RESONANCES:
        cross_res = breitwigner(SIG0[0], WIDTH[0], AMRES[0], x) * Ef(x, 0.152, 0.17);
        sig_res[0] = cross_res;

        for (int Ni = 1; Ni < 9; ++Ni) {
            sig_res[Ni] = breitwigner(SIG0[Ni], WIDTH[Ni], AMRES[Ni], x) * Ef(x, 0.15, 0.38);
            cross_res += sig_res[Ni];
        }
        // DIRECT CHANNEL:
        if (x > 0.1 && x < 0.6) {
            cross_dir1 = singleback(x) + 40. * std::exp(-(x - 0.29) * (x - 0.29) / 0.002) - 15. * std::exp(-(x - 0.37) * (x - 0.37) / 0.002);
        } else {
            cross_dir1 = singleback(x);
        }
        cross_dir2 = twoback(x);
        cross_dir = cross_dir1 + cross_dir2;
    }

    // FRAGMENTATION 2:
    double cross_frag2 = 0.;
    if (NL0 == 13) {
          cross_frag2 = 80.3 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    } else if (NL0 == 14) {
          cross_frag2 = 60.2 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    }

    // MULTIPION PRODUCTION/FRAGMENTATION 1 CROSS SECTION
    double cross_diffr = 0.;
    double cross_diffr1 = 0.;
    double cross_diffr2 = 0.;
    double cs_multidiff = 0.;
    double cs_multi = 0.;
    if (x > 0.85) {
        double ss1 = (x - .85) / .69;
        double ss2 = 0.;
        if (NL0 == 13) {
            ss2 = 29.3 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        } else if (NL0 == 14) {
            ss2 = 26.4 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        }
        cs_multidiff = (1. - std::exp(-ss1)) * ss2;
        cs_multi = 0.89 * cs_multidiff;

        // DIFFRACTIVE SCATTERING:
        cross_diffr1 = .099 * cs_multidiff;
        cross_diffr2 = .011 * cs_multidiff;
        cross_diffr = 0.11 * cs_multidiff;

        ss1 = std::pow((x - .85), .75) / .64;
        ss2 = 74.1 * std::pow(x, -.44) + 62. * std::pow(s, .08);
        double cs_tmp = 0.96 * (1. - std::exp(-ss1)) * ss2;
        cross_diffr1 = 0.14 * cs_tmp;
        cross_diffr2 = 0.013 * cs_tmp;
        double cs_delta = cross_frag2 - (cross_diffr1 + cross_diffr2 - cross_diffr);
        if (cs_delta < 0.) {
            cross_frag2 = 0.;
            cs_multi += cs_delta;
        } else {
            cross_frag2 = cs_delta;
        }
        cross_diffr = cross_diffr1 + cross_diffr2;
        cs_multidiff = cs_multi + cross_diffr;
    }

    double xSection = 0.;
    switch (NDIR) {
        case 0:
            xSection = cross_res + cross_dir + cross_diffr + cross_frag2;
            break;
        case 1:
            xSection = cross_res;
            break;
        case 2:
            xSection = cross_res + cross_dir;
            break;
        case 3:
            xSection = cross_res + cross_dir + cs_multidiff + cross_frag2;
            break;
        case 4:
            xSection = cross_dir;
            break;
        case 5:
            xSection = cs_multi;
            break;
        case 6:
            xSection = cross_res + cross_dir2;
            break;
        case 7:
            xSection = cross_res + cross_dir1;
            break;
        case 8:
            xSection = cross_res + cross_dir + cross_diffr1;
            break;
        case 9:
            xSection = cross_res + cross_dir + cross_diffr;
            break;
        case 10:
            xSection = cross_diffr;
            break;
        case 11:
        case 12:
        case 13:
        case 14:
        case 15:
        case 16:
        case 17:
        case 18:
        case 19:
            xSection = sig_res[NDIR - 11];
            break;
        default:
            throw std::runtime_error("wrong input NDIR in crossection.f !");
    }
    return xSection;
}